

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsInteractionTestUtil.cpp
# Opt level: O0

void deqp::gls::InteractionTestUtil::computeRandomRenderState
               (Random *rnd,RenderState *state,ApiType apiType,int targetWidth,int targetHeight)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  bool *pbVar5;
  float fVar6;
  int local_a0;
  undefined8 uStack_9c;
  int ndx_1;
  undefined8 local_94;
  deUint32 local_8c;
  int local_88;
  int iStack_84;
  int ndx;
  int local_7c;
  int iStack_78;
  int local_74;
  int local_70;
  int scissorY;
  int scissorX;
  int scissorH;
  int scissorW;
  int maxScissorH;
  int maxScissorW;
  int minScissorH;
  int minScissorW;
  float minScissorSize;
  int maxScissorOutOfBounds;
  int maxStencilVal;
  int minStencilVal;
  float colorWriteProbability;
  float depthWriteProbability;
  float ditherProbability;
  float blendProbability;
  float depthTestProbability;
  float stencilTestProbability;
  float scissorTestProbability;
  int targetHeight_local;
  int targetWidth_local;
  RenderState *state_local;
  Random *rnd_local;
  ApiType apiType_local;
  
  depthTestProbability = 0.2;
  blendProbability = 0.4;
  ditherProbability = 0.6;
  depthWriteProbability = 0.4;
  colorWriteProbability = 0.5;
  minStencilVal = 0x3f333333;
  maxStencilVal = 0x3f333333;
  maxScissorOutOfBounds = -3;
  minScissorSize = 3.64338e-43;
  minScissorW = 10;
  minScissorH = 0x3f333333;
  stencilTestProbability = (float)targetHeight;
  scissorTestProbability = (float)targetWidth;
  _targetHeight_local = state;
  state_local = (RenderState *)rnd;
  rnd_local._4_4_ = apiType.m_bits;
  fVar6 = de::Random::getFloat(rnd);
  _targetHeight_local->scissorTestEnabled = fVar6 < 0.2;
  fVar6 = de::Random::getFloat((Random *)state_local);
  _targetHeight_local->stencilTestEnabled = fVar6 < 0.4;
  fVar6 = de::Random::getFloat((Random *)state_local);
  _targetHeight_local->depthTestEnabled = fVar6 < 0.6;
  fVar6 = de::Random::getFloat((Random *)state_local);
  _targetHeight_local->blendEnabled = fVar6 < 0.4;
  fVar6 = de::Random::getFloat((Random *)state_local);
  _targetHeight_local->ditherEnabled = fVar6 < 0.5;
  if ((_targetHeight_local->scissorTestEnabled & 1U) != 0) {
    maxScissorW = ::deCeilFloatToInt32((float)(int)scissorTestProbability * 0.7);
    maxScissorH = ::deCeilFloatToInt32((float)(int)stencilTestProbability * 0.7);
    scissorW = (int)scissorTestProbability + 0x14;
    scissorH = (int)stencilTestProbability + 0x14;
    scissorX = de::Random::getInt((Random *)state_local,maxScissorW,scissorW);
    scissorY = de::Random::getInt((Random *)state_local,maxScissorH,scissorH);
    local_70 = de::Random::getInt((Random *)state_local,-10,
                                  ((int)scissorTestProbability + 10) - scissorX);
    local_74 = de::Random::getInt((Random *)state_local,-10,
                                  ((int)stencilTestProbability + 10) - scissorY);
    rr::WindowRectangle::WindowRectangle
              ((WindowRectangle *)&stack0xffffffffffffff7c,local_70,local_74,scissorX,scissorY);
    (_targetHeight_local->scissorRectangle).left = iStack_84;
    (_targetHeight_local->scissorRectangle).bottom = ndx;
    (_targetHeight_local->scissorRectangle).width = local_7c;
    (_targetHeight_local->scissorRectangle).height = iStack_78;
  }
  if ((_targetHeight_local->stencilTestEnabled & 1U) != 0) {
    for (local_88 = 0; local_88 < 2; local_88 = local_88 + 1) {
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::compareFuncs,
                         computeRandomRenderState::stencilOps);
      _targetHeight_local->stencil[local_88].function = uVar2;
      iVar3 = de::Random::getInt((Random *)state_local,-3,0x104);
      _targetHeight_local->stencil[local_88].reference = iVar3;
      dVar4 = de::Random::getUint32((Random *)state_local);
      _targetHeight_local->stencil[local_88].compareMask = dVar4;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::stencilOps,
                         computeRandomRenderState::blendEquations);
      _targetHeight_local->stencil[local_88].stencilFailOp = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::stencilOps,
                         computeRandomRenderState::blendEquations);
      _targetHeight_local->stencil[local_88].depthFailOp = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::stencilOps,
                         computeRandomRenderState::blendEquations);
      _targetHeight_local->stencil[local_88].depthPassOp = uVar2;
      dVar4 = de::Random::getUint32((Random *)state_local);
      _targetHeight_local->stencil[local_88].writeMask = dVar4;
    }
  }
  if ((_targetHeight_local->depthTestEnabled & 1U) != 0) {
    uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      ((Random *)state_local,computeRandomRenderState::compareFuncs,
                       computeRandomRenderState::stencilOps);
    _targetHeight_local->depthFunc = uVar2;
    fVar6 = de::Random::getFloat((Random *)state_local);
    _targetHeight_local->depthWriteMask = fVar6 < 0.7;
  }
  if ((_targetHeight_local->blendEnabled & 1U) != 0) {
    local_8c = (deUint32)glu::ApiType::es(2,0);
    bVar1 = glu::ApiType::operator==((ApiType *)((long)&rnd_local + 4),(ApiType)local_8c);
    if (bVar1) {
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendEquationsES2,
                         (uint *)&DAT_02c6d6e8);
      (_targetHeight_local->blendRGBState).equation = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (_targetHeight_local->blendRGBState).srcFunc = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncsDstES2,
                         (uint *)&DAT_02c6d728);
      (_targetHeight_local->blendRGBState).dstFunc = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendEquationsES2,
                         (uint *)&DAT_02c6d6e8);
      (_targetHeight_local->blendAState).equation = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (_targetHeight_local->blendAState).srcFunc = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncsDstES2,
                         (uint *)&DAT_02c6d728);
      (_targetHeight_local->blendAState).dstFunc = uVar2;
    }
    else {
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendEquations,
                         (uint *)&DAT_02c6d694);
      (_targetHeight_local->blendRGBState).equation = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (_targetHeight_local->blendRGBState).srcFunc = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (_targetHeight_local->blendRGBState).dstFunc = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendEquations,
                         (uint *)&DAT_02c6d694);
      (_targetHeight_local->blendAState).equation = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (_targetHeight_local->blendAState).srcFunc = uVar2;
      uVar2 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)state_local,computeRandomRenderState::blendFuncs,
                         computeRandomRenderState::blendEquationsES2);
      (_targetHeight_local->blendAState).dstFunc = uVar2;
    }
    getRandomColor((InteractionTestUtil *)&stack0xffffffffffffff64,(Random *)state_local);
    *(undefined8 *)(_targetHeight_local->blendColor).m_data = uStack_9c;
    *(undefined8 *)((_targetHeight_local->blendColor).m_data + 2) = local_94;
  }
  for (local_a0 = 0; local_a0 < 4; local_a0 = local_a0 + 1) {
    fVar6 = de::Random::getFloat((Random *)state_local);
    pbVar5 = tcu::Vector<bool,_4>::operator[](&_targetHeight_local->colorMask,local_a0);
    *pbVar5 = fVar6 < 0.7;
  }
  return;
}

Assistant:

void computeRandomRenderState (de::Random& rnd, RenderState& state, glu::ApiType apiType, int targetWidth, int targetHeight)
{
	// Constants governing randomization.
	const float		scissorTestProbability		= 0.2f;
	const float		stencilTestProbability		= 0.4f;
	const float		depthTestProbability		= 0.6f;
	const float		blendProbability			= 0.4f;
	const float		ditherProbability			= 0.5f;

	const float		depthWriteProbability		= 0.7f;
	const float		colorWriteProbability		= 0.7f;

	const int		minStencilVal				= -3;
	const int		maxStencilVal				= 260;

	const int		maxScissorOutOfBounds		= 10;
	const float		minScissorSize				= 0.7f;

	static const deUint32 compareFuncs[] =
	{
		GL_NEVER,
		GL_ALWAYS,
		GL_LESS,
		GL_LEQUAL,
		GL_EQUAL,
		GL_GEQUAL,
		GL_GREATER,
		GL_NOTEQUAL
	};

	static const deUint32 stencilOps[] =
	{
		GL_KEEP,
		GL_ZERO,
		GL_REPLACE,
		GL_INCR,
		GL_DECR,
		GL_INVERT,
		GL_INCR_WRAP,
		GL_DECR_WRAP
	};

	static const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	static const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	static const deUint32 blendEquationsES2[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT
	};

	static const deUint32 blendFuncsDstES2[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA
	};

	state.scissorTestEnabled	= rnd.getFloat() < scissorTestProbability;
	state.stencilTestEnabled	= rnd.getFloat() < stencilTestProbability;
	state.depthTestEnabled		= rnd.getFloat() < depthTestProbability;
	state.blendEnabled			= rnd.getFloat() < blendProbability;
	state.ditherEnabled			= rnd.getFloat() < ditherProbability;

	if (state.scissorTestEnabled)
	{
		int minScissorW		= deCeilFloatToInt32(minScissorSize * (float)targetWidth);
		int minScissorH		= deCeilFloatToInt32(minScissorSize * (float)targetHeight);
		int maxScissorW		= targetWidth + 2*maxScissorOutOfBounds;
		int maxScissorH		= targetHeight + 2*maxScissorOutOfBounds;

		int scissorW		= rnd.getInt(minScissorW, maxScissorW);
		int	scissorH		= rnd.getInt(minScissorH, maxScissorH);
		int scissorX		= rnd.getInt(-maxScissorOutOfBounds, targetWidth+maxScissorOutOfBounds-scissorW);
		int scissorY		= rnd.getInt(-maxScissorOutOfBounds, targetHeight+maxScissorOutOfBounds-scissorH);

		state.scissorRectangle = rr::WindowRectangle(scissorX, scissorY, scissorW, scissorH);
	}

	if (state.stencilTestEnabled)
	{
		for (int ndx = 0; ndx < 2; ndx++)
		{
			state.stencil[ndx].function			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
			state.stencil[ndx].reference		= rnd.getInt(minStencilVal, maxStencilVal);
			state.stencil[ndx].compareMask		= rnd.getUint32();
			state.stencil[ndx].stencilFailOp	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthFailOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].depthPassOp		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(stencilOps), DE_ARRAY_END(stencilOps));
			state.stencil[ndx].writeMask		= rnd.getUint32();
		}
	}

	if (state.depthTestEnabled)
	{
		state.depthFunc			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(compareFuncs), DE_ARRAY_END(compareFuncs));
		state.depthWriteMask	= rnd.getFloat() < depthWriteProbability;
	}

	if (state.blendEnabled)
	{
		if (apiType == glu::ApiType::es(2,0))
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquationsES2), DE_ARRAY_END(blendEquationsES2));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncsDstES2), DE_ARRAY_END(blendFuncsDstES2));
		}
		else
		{
			state.blendRGBState.equation	= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendRGBState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendRGBState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));

			state.blendAState.equation		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendEquations), DE_ARRAY_END(blendEquations));
			state.blendAState.srcFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
			state.blendAState.dstFunc		= rnd.choose<deUint32>(DE_ARRAY_BEGIN(blendFuncs), DE_ARRAY_END(blendFuncs));
		}

		state.blendColor				= getRandomColor(rnd);
	}

	for (int ndx = 0; ndx < 4; ndx++)
		state.colorMask[ndx] = rnd.getFloat() < colorWriteProbability;
}